

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  Status SVar4;
  unsigned_long uVar5;
  char *pcVar6;
  unsigned_long i;
  unsigned_long dindex;
  Directory d;
  string next;
  cmAlphaNum local_90;
  undefined1 local_60 [48];
  
  if ((*path == '.') && (path[1] == '\0')) {
    bVar2 = std::operator!=(&this->Format,"zip");
    if ((!bVar2) || (bVar2 = std::operator!=(&this->Format,"7zip"), !bVar2)) goto LAB_00119b4c;
  }
  bVar2 = AddFile(this,path,skip,prefix);
  if (!bVar2) {
    return false;
  }
LAB_00119b4c:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,path,(allocator<char> *)&next);
  bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&local_90);
  if (bVar2 && recursive) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,path,(allocator<char> *)&d);
    bVar3 = cmsys::SystemTools::FileIsSymlink((string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = true;
    if (!bVar3) {
      cmsys::Directory::Directory(&d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,path,(allocator<char> *)local_60);
      SVar4 = cmsys::Directory::Load(&d,(string *)&local_90,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_90);
      bVar2 = true;
      if (SVar4.Kind_ == Success) {
        local_90.View_._M_len = strlen(path);
        local_60._8_8_ = local_60 + 0x10;
        local_60._0_8_ = (pointer)0x1;
        local_60[0x10] = '/';
        local_90.View_._M_str = path;
        cmStrCat<>(&next,&local_90,(cmAlphaNum *)local_60);
        bVar3 = std::operator==(&next,"./");
        if (bVar3) {
          bVar3 = std::operator==(&this->Format,"zip");
          if ((bVar3) || (bVar3 = std::operator==(&this->Format,"7zip"), bVar3)) {
            next._M_string_length = 0;
            *next._M_dataplus._M_p = '\0';
          }
        }
        sVar1 = next._M_string_length;
        uVar5 = cmsys::Directory::GetNumberOfFiles(&d);
        for (dindex = 0; uVar5 != dindex; dindex = dindex + 1) {
          pcVar6 = cmsys::Directory::GetFile(&d,dindex);
          if ((*pcVar6 != '.') ||
             ((pcVar6[1] != '\0' && ((pcVar6[1] != '.' || (pcVar6[2] != '\0')))))) {
            std::__cxx11::string::erase((ulong)&next,sVar1);
            std::__cxx11::string::append((char *)&next);
            bVar3 = AddPath(this,next._M_dataplus._M_p,skip,prefix,true);
            if (!bVar3) {
              std::__cxx11::string::~string((string *)&next);
              bVar2 = false;
              goto LAB_00119d61;
            }
          }
        }
        std::__cxx11::string::~string((string *)&next);
      }
LAB_00119d61:
      cmsys::Directory::~Directory(&d);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (strcmp(path, ".") != 0 ||
      (this->Format != "zip" && this->Format != "7zip")) {
    if (!this->AddFile(path, skip, prefix)) {
      return false;
    }
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = cmStrCat(path, '/');
    if (next == "./" && (this->Format == "zip" || this->Format == "7zip")) {
      next.clear();
    }
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}